

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O2

void __thiscall
ArgumentParser::Instance::Bind
          (Instance *this,
          MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *val)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.cxx:106:5)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.cxx:106:5)>
             ::_M_manager;
  local_30._M_unused._M_object = val;
  std::function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  operator=(&this->KeywordValueFunc,
            (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
             *)&local_30);
  this->KeywordValuesExpected = 0;
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return;
}

Assistant:

void Instance::Bind(MaybeEmpty<std::vector<std::string>>& val)
{
  this->Bind(
    [&val](cm::string_view arg) -> Continue {
      val.emplace_back(arg);
      return Continue::Yes;
    },
    ExpectAtLeast{ 0 });
}